

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall wasm::PassRunner::runPass(PassRunner *this,Pass *pass)

{
  AfterEffectModuleChecker *__ptr;
  int iVar1;
  const_iterator cVar2;
  AfterEffectModuleChecker *this_00;
  __hashtable *__h;
  pointer __p;
  bool bVar3;
  AfterEffectModuleChecker *local_30;
  AfterEffectModuleChecker *local_28;
  unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  checker;
  
  iVar1 = (*pass->_vptr_Pass[4])(pass);
  if ((char)iVar1 != '\0') {
    __assert_fail("!pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x3ba,"void wasm::PassRunner::runPass(Pass *)");
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->options).passesToSkip._M_h,&pass->name);
  if (cVar2.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_28 = (AfterEffectModuleChecker *)0x0;
    iVar1 = getPassDebug();
    if (iVar1 != 0) {
      this_00 = (AfterEffectModuleChecker *)operator_new(0x28);
      AfterEffectModuleChecker::AfterEffectModuleChecker(this_00,this->wasm);
      __ptr = local_28;
      local_30 = (AfterEffectModuleChecker *)0x0;
      bVar3 = local_28 != (AfterEffectModuleChecker *)0x0;
      local_28 = this_00;
      if (bVar3) {
        std::default_delete<wasm::AfterEffectModuleChecker>::operator()
                  ((default_delete<wasm::AfterEffectModuleChecker> *)&local_28,__ptr);
      }
      if (local_30 != (AfterEffectModuleChecker *)0x0) {
        std::default_delete<wasm::AfterEffectModuleChecker>::operator()
                  ((default_delete<wasm::AfterEffectModuleChecker> *)&local_30,local_30);
      }
    }
    if (pass->runner != (PassRunner *)0x0) {
      __assert_fail("!pass->getPassRunner()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                    ,0x3c8,"void wasm::PassRunner::runPass(Pass *)");
    }
    pass->runner = this;
    (*pass->_vptr_Pass[2])(pass,this->wasm);
    handleAfterEffects(this,pass,(Function *)0x0);
    iVar1 = getPassDebug();
    if (iVar1 != 0) {
      AfterEffectModuleChecker::check(local_28);
    }
    if (local_28 != (AfterEffectModuleChecker *)0x0) {
      std::default_delete<wasm::AfterEffectModuleChecker>::operator()
                ((default_delete<wasm::AfterEffectModuleChecker> *)&local_28,local_28);
    }
  }
  else {
    local_28 = (AfterEffectModuleChecker *)&this->skippedPasses;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_28,&pass->name);
  }
  return;
}

Assistant:

void PassRunner::runPass(Pass* pass) {
  assert(!pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    skippedPasses.insert(pass->name);
    return;
  }

  std::unique_ptr<AfterEffectModuleChecker> checker;
  if (getPassDebug()) {
    checker = std::unique_ptr<AfterEffectModuleChecker>(
      new AfterEffectModuleChecker(wasm));
  }
  // Passes can only be run once and we deliberately do not clear the pass
  // runner after running the pass, so there must not already be a runner here.
  assert(!pass->getPassRunner());
  pass->setPassRunner(this);
  pass->run(wasm);
  handleAfterEffects(pass);
  if (getPassDebug()) {
    checker->check();
  }
}